

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O0

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForQuadsTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  *this_00;
  bool bVar1;
  float fVar2;
  const_reference pvVar3;
  reference p_Var4;
  size_type sVar5;
  reference pvVar6;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  TestError *this_02;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing vertex_spacing;
  float fVar8;
  float fVar9;
  float fVar10;
  _tess_edge *edge_2;
  uint n_edge_2;
  const_iterator local_4c8;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_4c0;
  _tess_coordinate_cartesian *local_4b8;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_4b0;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_4a8;
  iterator dataset_iterator;
  _tess_coordinate_cartesian *coordinate_2;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_490;
  __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_488;
  const_iterator iterator_2;
  _tess_edge *edge_1;
  _tess_coordinate_cartesian _Stack_470;
  uint n_edge_1;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_468;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_460;
  _tess_coordinate_cartesian *local_458;
  MessageBuilder local_450;
  undefined1 local_2d0 [8];
  string vertex_spacing_string;
  string primitive_mode_string;
  _tess_coordinate_cartesian local_288;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_280;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_278;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_270;
  _tess_coordinate_cartesian *local_268;
  _tess_coordinate_cartesian *coordinate_1;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_258;
  __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_250;
  const_iterator iterator_1;
  _tess_coordinate_cartesian edge_end_point;
  _tess_coordinate_cartesian edge_start_point;
  _tess_edge *edge;
  uint n_edge;
  uint n_edge_ptrs;
  _tess_edge *edge_ptrs [4];
  undefined1 local_200 [8];
  _tess_edge bl_tl_edge;
  undefined1 local_1d0 [8];
  _tess_edge br_bl_edge;
  undefined1 local_1a0 [8];
  _tess_edge tr_br_edge;
  undefined1 local_170 [8];
  _tess_edge tl_tr_edge;
  float bl_tl_delta;
  float br_bl_delta;
  float tr_br_delta;
  float tl_tr_delta;
  const_iterator local_130;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_128;
  _tess_coordinate_cartesian *local_120;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_118;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_110;
  iterator iterator;
  _tess_coordinate_cartesian *corner_coordinate;
  uint n_corner_coordinate;
  uint n_corner_coordinate_ptrs;
  _tess_coordinate_cartesian *corner_coordinate_ptrs [4];
  float delta;
  float delta_y;
  float delta_x;
  _tess_coordinate_cartesian *coordinate;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_b0;
  __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  local_a8;
  const_iterator coordinate_iterator;
  float current_br_point_delta;
  _tess_coordinate_cartesian current_br_point;
  float current_bl_point_delta;
  _tess_coordinate_cartesian current_bl_point;
  float current_tr_point_delta;
  _tess_coordinate_cartesian current_tr_point;
  float current_tl_point_delta;
  _tess_coordinate_cartesian current_tl_point;
  uint n_iteration;
  uint n_iterations;
  float *vertex_data;
  _tess_coordinate_cartesian local_4c;
  _tess_coordinate_cartesian new_coordinate;
  uint n_vertex;
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  coordinates;
  _run *run_local;
  TessellationShaderVertexSpacing *this_local;
  _tess_edges *result;
  
  std::
  vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  ::vector((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            *)&new_coordinate.y);
  for (new_coordinate.x = 0.0; (uint)new_coordinate.x < run->n_vertices;
      new_coordinate.x = (float)((int)new_coordinate.x + 1)) {
    _tess_coordinate_cartesian::_tess_coordinate_cartesian(&local_4c);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&run->data,0);
    local_4c.x = *(float *)(pvVar3 + (ulong)(uint)((int)new_coordinate.x * 3) * 4);
    local_4c.y = *(float *)((long)(pvVar3 + (ulong)(uint)((int)new_coordinate.x * 3) * 4) + 4);
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)&new_coordinate.y,&local_4c);
  }
  fVar2 = 1.4013e-45;
  if (1.0 < run->inner[0]) {
    fVar2 = 2.8026e-45;
  }
  current_tl_point.x = 0.0;
  do {
    if ((uint)fVar2 <= (uint)current_tl_point.x) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::~vector((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)&new_coordinate.y);
      return __return_storage_ptr__;
    }
    _tess_coordinate_cartesian::_tess_coordinate_cartesian
              ((_tess_coordinate_cartesian *)&current_tr_point.y);
    current_tr_point.x = 0.0;
    _tess_coordinate_cartesian::_tess_coordinate_cartesian
              ((_tess_coordinate_cartesian *)&current_bl_point.y);
    current_bl_point.x = 0.0;
    _tess_coordinate_cartesian::_tess_coordinate_cartesian
              ((_tess_coordinate_cartesian *)&current_br_point.y);
    current_br_point.x = 0.0;
    _tess_coordinate_cartesian::_tess_coordinate_cartesian
              ((_tess_coordinate_cartesian *)((long)&coordinate_iterator._M_current + 4));
    coordinate_iterator._M_current._0_4_ = 0.0;
    local_b0._M_current =
         (_tess_coordinate_cartesian *)
         std::
         vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
         ::begin((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  *)&new_coordinate.y);
    __gnu_cxx::
    __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
    ::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*>
              ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
                *)&local_a8,&local_b0);
    while( true ) {
      coordinate = (_tess_coordinate_cartesian *)
                   std::
                   vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                          *)&new_coordinate.y);
      bVar1 = __gnu_cxx::operator!=
                        (&local_a8,
                         (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                          *)&coordinate);
      if (!bVar1) break;
      p_Var4 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
               ::operator*(&local_a8);
      fVar8 = p_Var4->x - 0.5;
      fVar9 = p_Var4->y - 0.5;
      fVar10 = ::deFloatSqrt(fVar8 * fVar8 + fVar9 * fVar9);
      if (((fVar8 <= 0.0) && (0.0 <= fVar9)) && (current_tr_point.x < fVar10)) {
        unique0x00012000 = *p_Var4;
        current_tr_point.x = fVar10;
      }
      if (((0.0 <= fVar8) && (0.0 <= fVar9)) && (current_bl_point.x < fVar10)) {
        unique0x00012000 = *p_Var4;
        current_bl_point.x = fVar10;
      }
      if (((fVar8 <= 0.0) && (fVar9 <= 0.0)) && (current_br_point.x < fVar10)) {
        unique0x00012000 = *p_Var4;
        current_br_point.x = fVar10;
      }
      if (((0.0 <= fVar8) && (fVar9 <= 0.0)) && (coordinate_iterator._M_current._0_4_ < fVar10)) {
        unique0x00012000 = *p_Var4;
        coordinate_iterator._M_current._0_4_ = fVar10;
      }
      corner_coordinate_ptrs[3] =
           (_tess_coordinate_cartesian *)
           __gnu_cxx::
           __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
           ::operator++(&local_a8,0);
    }
    _n_corner_coordinate = &current_tr_point.y;
    corner_coordinate_ptrs[0] = (_tess_coordinate_cartesian *)&current_bl_point.y;
    corner_coordinate_ptrs[1] = (_tess_coordinate_cartesian *)&current_br_point.y;
    corner_coordinate_ptrs[2] =
         (_tess_coordinate_cartesian *)((long)&coordinate_iterator._M_current + 4);
    for (corner_coordinate._0_4_ = 0; (uint)corner_coordinate < 4;
        corner_coordinate._0_4_ = (uint)corner_coordinate + 1) {
      iterator._M_current =
           *(_tess_coordinate_cartesian **)
            (&n_corner_coordinate + (ulong)(uint)corner_coordinate * 2);
      local_118._M_current =
           (_tess_coordinate_cartesian *)
           std::
           vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
           ::begin((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                    *)&new_coordinate.y);
      local_120 = (_tess_coordinate_cartesian *)
                  std::
                  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                         *)&new_coordinate.y);
      local_110 = std::
                  find<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>
                            (local_118,
                             (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                              )local_120,iterator._M_current);
      local_128._M_current =
           (_tess_coordinate_cartesian *)
           std::
           vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
           ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  *)&new_coordinate.y);
      bVar1 = __gnu_cxx::operator!=(&local_110,&local_128);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
        ::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*>
                  ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
                    *)&local_130,&local_110);
        _tr_br_delta = std::
                       vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                       ::erase((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                *)&new_coordinate.y,local_130);
      }
    }
    br_bl_delta = ::deFloatSqrt((current_tr_point.y - current_bl_point.y) *
                                (current_tr_point.y - current_bl_point.y) +
                                (current_tl_point_delta - current_tr_point_delta) *
                                (current_tl_point_delta - current_tr_point_delta));
    bl_tl_delta = ::deFloatSqrt((current_bl_point.y - coordinate_iterator._M_current._4_4_) *
                                (current_bl_point.y - coordinate_iterator._M_current._4_4_) +
                                (current_tr_point_delta - current_br_point_delta) *
                                (current_tr_point_delta - current_br_point_delta));
    tl_tr_edge._36_4_ =
         ::deFloatSqrt((coordinate_iterator._M_current._4_4_ - current_br_point.y) *
                       (coordinate_iterator._M_current._4_4_ - current_br_point.y) +
                       (current_br_point_delta - current_bl_point_delta) *
                       (current_br_point_delta - current_bl_point_delta));
    tl_tr_edge.tess_level =
         ::deFloatSqrt((current_br_point.y - current_tr_point.y) *
                       (current_br_point.y - current_tr_point.y) +
                       (current_bl_point_delta - current_tl_point_delta) *
                       (current_bl_point_delta - current_tl_point_delta));
    tr_br_edge._36_4_ = 0;
    tr_br_edge.tess_level = 0.0;
    _tess_edge::_tess_edge
              ((_tess_edge *)local_170,(float *)&tr_br_edge.field_0x24,&tr_br_edge.tess_level,
               &br_bl_delta);
    br_bl_edge._36_4_ = 0;
    br_bl_edge.tess_level = 0.0;
    _tess_edge::_tess_edge
              ((_tess_edge *)local_1a0,(float *)&br_bl_edge.field_0x24,&br_bl_edge.tess_level,
               &bl_tl_delta);
    bl_tl_edge._36_4_ = 0;
    bl_tl_edge.tess_level = 0.0;
    _tess_edge::_tess_edge
              ((_tess_edge *)local_1d0,(float *)&bl_tl_edge.field_0x24,&bl_tl_edge.tess_level,
               (float *)&tl_tr_edge.field_0x24);
    edge_ptrs[3]._4_4_ = 0;
    edge_ptrs[3]._0_4_ = 0;
    _tess_edge::_tess_edge
              ((_tess_edge *)local_200,(float *)((long)edge_ptrs + 0x1c),(float *)(edge_ptrs + 3),
               &tl_tr_edge.tess_level);
    tl_tr_edge.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = run->outer[3];
    tr_br_edge.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = run->outer[2];
    br_bl_edge.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = run->outer[1];
    bl_tl_edge.points.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = run->outer[0];
    if (current_tl_point.x == 0.0) {
      tl_tr_edge.edge_length = run->outer[3];
      tr_br_edge.edge_length = run->outer[2];
      br_bl_edge.edge_length = run->outer[1];
      bl_tl_edge.edge_length = run->outer[0];
    }
    else {
      tl_tr_edge.edge_length = run->inner[0] - 2.0;
      br_bl_edge.edge_length = run->inner[0] - 2.0;
      tr_br_edge.edge_length = run->inner[1] - 2.0;
      bl_tl_edge.edge_length = run->inner[1] - 2.0;
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)local_170,(value_type *)&current_tr_point.y);
    bVar1 = _tess_coordinate_cartesian::operator==
                      ((_tess_coordinate_cartesian *)&current_tr_point.y,
                       (_tess_coordinate_cartesian *)&current_bl_point.y);
    if (!bVar1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)local_170,(value_type *)&current_bl_point.y);
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)local_1a0,(value_type *)&current_bl_point.y);
    bVar1 = _tess_coordinate_cartesian::operator==
                      ((_tess_coordinate_cartesian *)&current_bl_point.y,
                       (_tess_coordinate_cartesian *)((long)&coordinate_iterator._M_current + 4));
    if (!bVar1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)local_1a0,(value_type *)((long)&coordinate_iterator._M_current + 4));
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)local_1d0,(value_type *)((long)&coordinate_iterator._M_current + 4));
    bVar1 = _tess_coordinate_cartesian::operator==
                      ((_tess_coordinate_cartesian *)((long)&coordinate_iterator._M_current + 4),
                       (_tess_coordinate_cartesian *)&current_br_point.y);
    if (!bVar1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)local_1d0,(value_type *)&current_br_point.y);
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
    ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 *)local_200,(value_type *)&current_br_point.y);
    bVar1 = _tess_coordinate_cartesian::operator==
                      ((_tess_coordinate_cartesian *)&current_br_point.y,
                       (_tess_coordinate_cartesian *)&current_tr_point.y);
    if (!bVar1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
      ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)local_200,(value_type *)&current_tr_point.y);
    }
    _n_edge = local_170;
    edge_ptrs[0] = (_tess_edge *)local_1a0;
    edge_ptrs[1] = (_tess_edge *)local_1d0;
    edge_ptrs[2] = (_tess_edge *)local_200;
    for (edge._0_4_ = 0; (uint)edge < 4; edge._0_4_ = (uint)edge + 1) {
      this_00 = *(vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                  **)(&n_edge + (ulong)(uint)edge * 2);
      sVar5 = std::
              vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
              ::size(this_00);
      if (1 < sVar5) {
        pvVar6 = std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::operator[](this_00,0);
        edge_end_point = *pvVar6;
        pvVar6 = std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::operator[](this_00,1);
        iterator_1._M_current = *(_tess_coordinate_cartesian **)pvVar6;
        local_258._M_current =
             (_tess_coordinate_cartesian *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ::begin((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                      *)&new_coordinate.y);
        __gnu_cxx::
        __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
        ::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*>
                  ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
                    *)&local_250,&local_258);
        while( true ) {
          coordinate_1 = (_tess_coordinate_cartesian *)
                         std::
                         vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                         ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                *)&new_coordinate.y);
          bVar1 = __gnu_cxx::operator!=
                            (&local_250,
                             (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                              *)&coordinate_1);
          if (!bVar1) break;
          local_268 = __gnu_cxx::
                      __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                      ::operator*(&local_250);
          bVar1 = isPointOnLine(this,&edge_end_point,(_tess_coordinate_cartesian *)&iterator_1,
                                local_268);
          if (((bVar1) &&
              (bVar1 = _tess_coordinate_cartesian::operator==(&edge_end_point,local_268), !bVar1))
             && (bVar1 = _tess_coordinate_cartesian::operator==
                                   ((_tess_coordinate_cartesian *)&iterator_1,local_268), !bVar1)) {
            local_278._M_current =
                 (_tess_coordinate_cartesian *)
                 std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::begin(this_00);
            local_280._M_current =
                 (_tess_coordinate_cartesian *)
                 std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::end(this_00);
            _comparator_exact_tess_coordinate_match::_comparator_exact_tess_coordinate_match
                      ((_comparator_exact_tess_coordinate_match *)&local_288,local_268);
            local_270 = std::
                        find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,glcts::TessellationShaderVertexSpacing::_comparator_exact_tess_coordinate_match>
                                  (local_278,local_280,
                                   (_comparator_exact_tess_coordinate_match)local_288);
            primitive_mode_string.field_2._8_8_ =
                 std::
                 vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ::end(this_00);
            bVar1 = __gnu_cxx::operator==
                              (&local_270,
                               (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                                *)((long)&primitive_mode_string.field_2 + 8));
            if (!bVar1) {
              TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                        ((string *)((long)&vertex_spacing_string.field_2 + 8),
                         (TessellationShaderUtils *)(ulong)run->primitive_mode,primitive_mode);
              TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                        ((string *)local_2d0,(TessellationShaderUtils *)(ulong)run->vertex_spacing,
                         vertex_spacing);
              this_01 = tcu::TestContext::getLog
                                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.
                                   m_testCtx);
              tcu::TestLog::operator<<
                        (&local_450,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (&local_450,(char (*) [19])"A duplicate vertex");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2b0b32e);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_268->x);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_268->y);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(char (*) [77])
                                         ") was found in set of coordinates generated for the following configuration:"
                                 );
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(char (*) [29])" inner tessellation levels:(");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(char (*) [30])") outer tessellation levels:(");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])") primitive mode:");
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&vertex_spacing_string.field_2 + 8));
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [22])0x2b20c66);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_2d0);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])" point mode:yes");
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_450);
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,
                         "A duplicate vertex was found in generated tessellation coordinate set when point mode was used"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x1d9);
              __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            std::
            vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            ::push_back(this_00,local_268);
          }
          local_458 = (_tess_coordinate_cartesian *)
                      __gnu_cxx::
                      __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                      ::operator++(&local_250,0);
        }
        local_460._M_current =
             (_tess_coordinate_cartesian *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ::begin(this_00);
        local_468._M_current =
             (_tess_coordinate_cartesian *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ::end(this_00);
        _comparator_relative_to_base_point::_comparator_relative_to_base_point
                  ((_comparator_relative_to_base_point *)&stack0xfffffffffffffb90,&edge_end_point);
        std::
        sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>
                  (local_460,local_468,(_comparator_relative_to_base_point)_Stack_470);
      }
    }
    for (edge_1._4_4_ = 0; edge_1._4_4_ < 4; edge_1._4_4_ = edge_1._4_4_ + 1) {
      iterator_2._M_current = *(_tess_coordinate_cartesian **)(&n_edge + (ulong)edge_1._4_4_ * 2);
      local_490._M_current =
           (_tess_coordinate_cartesian *)
           std::
           vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
           ::begin(iterator_2._M_current);
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
      ::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*>
                ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
                  *)&local_488,&local_490);
      while( true ) {
        coordinate_2 = (_tess_coordinate_cartesian *)
                       std::
                       vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                       ::end(iterator_2._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_488,
                           (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                            *)&coordinate_2);
        if (!bVar1) break;
        dataset_iterator._M_current =
             __gnu_cxx::
             __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
             ::operator*(&local_488);
        local_4b0._M_current =
             (_tess_coordinate_cartesian *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ::begin((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                      *)&new_coordinate.y);
        local_4b8 = (_tess_coordinate_cartesian *)
                    std::
                    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                    ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                           *)&new_coordinate.y);
        local_4a8 = std::
                    find<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>
                              (local_4b0,
                               (__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
                                )local_4b8,dataset_iterator._M_current);
        local_4c0._M_current =
             (_tess_coordinate_cartesian *)
             std::
             vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ::end((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                    *)&new_coordinate.y);
        bVar1 = __gnu_cxx::operator!=(&local_4a8,&local_4c0);
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
          ::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*>
                    ((__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>
                      *)&local_4c8,&local_4a8);
          std::
          vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
          ::erase((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   *)&new_coordinate.y,local_4c8);
        }
        __gnu_cxx::
        __normal_iterator<const_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
        ::operator++(&local_488,0);
      }
    }
    for (edge_2._4_4_ = 0; edge_2._4_4_ < 4; edge_2._4_4_ = edge_2._4_4_ + 1) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
      ::push_back(__return_storage_ptr__,*(value_type **)(&n_edge + (ulong)edge_2._4_4_ * 2));
    }
    _tess_edge::~_tess_edge((_tess_edge *)local_200);
    _tess_edge::~_tess_edge((_tess_edge *)local_1d0);
    _tess_edge::~_tess_edge((_tess_edge *)local_1a0);
    _tess_edge::~_tess_edge((_tess_edge *)local_170);
    current_tl_point.x = (float)((int)current_tl_point.x + 1);
  } while( true );
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForQuadsTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First, convert the raw coordinate array into a vector of cartesian coordinates.
	 * For this method, we will need to take out vertices in no specific order. */
	std::vector<_tess_coordinate_cartesian> coordinates;

	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		_tess_coordinate_cartesian new_coordinate;
		const float*			   vertex_data = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;

		new_coordinate.x = vertex_data[0];
		new_coordinate.y = vertex_data[1];

		coordinates.push_back(new_coordinate);
	}

	/* Data set is expected to describe an outer and inner rectangles. We will execute the quad extraction
	 * process in two iterations:
	 *
	 * - first iteration will determine all coordinates that are part of the outer quad;
	 * - second iteration will focus on the inner quad.
	 *
	 * Each iteration will start from identifying corner vertices:
	 *
	 * - top-left corner     (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive);
	 * - top-right corner    (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive);
	 * - bottom-left corner  (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative);
	 * - bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative);
	 *
	 * Once we know where the corner vertices are, we will remove them from the data set and iterate again over the
	 * data set to identify all points that are part of edges connecting the edge corners. After the loop is done,
	 * these vertices will have been associated with relevant edges and removed from the data sets.
	 *
	 * Once two iterations are complete, we're done.
	 */
	const unsigned int n_iterations = (run.inner[0] > 1) ? 2 : 1;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_tess_coordinate_cartesian current_tl_point;
		float					   current_tl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_tr_point;
		float					   current_tr_point_delta = 0.0f;
		_tess_coordinate_cartesian current_bl_point;
		float					   current_bl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_br_point;
		float					   current_br_point_delta = 0.0f;

		/* Iterate over all points */
		for (std::vector<_tess_coordinate_cartesian>::const_iterator coordinate_iterator = coordinates.begin();
			 coordinate_iterator != coordinates.end(); coordinate_iterator++)
		{
			const _tess_coordinate_cartesian& coordinate = *coordinate_iterator;
			float							  delta_x	= coordinate.x - 0.5f;
			float							  delta_y	= coordinate.y - 0.5f;
			float							  delta		 = deFloatSqrt(delta_x * delta_x + delta_y * delta_y);

			/* top-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive); */
			if (delta_x <= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tl_point_delta)
				{
					current_tl_point	   = coordinate;
					current_tl_point_delta = delta;
				}
			}

			/* top-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive); */
			if (delta_x >= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tr_point_delta)
				{
					current_tr_point	   = coordinate;
					current_tr_point_delta = delta;
				}
			}

			/* bottom-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative); */
			if (delta_x <= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_bl_point_delta)
				{
					current_bl_point	   = coordinate;
					current_bl_point_delta = delta;
				}
			}

			/* bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative); */
			if (delta_x >= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_br_point_delta)
				{
					current_br_point	   = coordinate;
					current_br_point_delta = delta;
				}
			}
		} /* for (all coordinates) */

		/* Note: If any of the outer tessellation level is 1, at least
		 *       two "current" points will refer to the same point.
		 *
		 * Now that we know where the corner vertices are, remove them from the data set
		 */
		const _tess_coordinate_cartesian* corner_coordinate_ptrs[] = { &current_tl_point, &current_tr_point,
																	   &current_bl_point, &current_br_point };
		const unsigned int n_corner_coordinate_ptrs =
			sizeof(corner_coordinate_ptrs) / sizeof(corner_coordinate_ptrs[0]);

		for (unsigned int n_corner_coordinate = 0; n_corner_coordinate < n_corner_coordinate_ptrs;
			 ++n_corner_coordinate)
		{
			const _tess_coordinate_cartesian& corner_coordinate = *(corner_coordinate_ptrs[n_corner_coordinate]);
			std::vector<_tess_coordinate_cartesian>::iterator iterator =
				std::find(coordinates.begin(), coordinates.end(), corner_coordinate);

			/* Iterator can be invalid at this point of any of the corner coordinates
			 * referred more than once to the same point. */
			if (iterator != coordinates.end())
			{
				coordinates.erase(iterator);
			}
		} /* for (all corner coordinates) */

		/* Proceed with identification of coordinates describing the edges.
		 *
		 * Note: for inner quad, we need to subtract 2 segments connecting outer and inner coordinates */
		float tl_tr_delta =
			deFloatSqrt((current_tl_point.x - current_tr_point.x) * (current_tl_point.x - current_tr_point.x) +
						(current_tl_point.y - current_tr_point.y) * (current_tl_point.y - current_tr_point.y));
		float tr_br_delta =
			deFloatSqrt((current_tr_point.x - current_br_point.x) * (current_tr_point.x - current_br_point.x) +
						(current_tr_point.y - current_br_point.y) * (current_tr_point.y - current_br_point.y));
		float br_bl_delta =
			deFloatSqrt((current_br_point.x - current_bl_point.x) * (current_br_point.x - current_bl_point.x) +
						(current_br_point.y - current_bl_point.y) * (current_br_point.y - current_bl_point.y));
		float bl_tl_delta =
			deFloatSqrt((current_bl_point.x - current_tl_point.x) * (current_bl_point.x - current_tl_point.x) +
						(current_bl_point.y - current_tl_point.y) * (current_bl_point.y - current_tl_point.y));

		_tess_edge tl_tr_edge(0, 0, tl_tr_delta);
		_tess_edge tr_br_edge(0, 0, tr_br_delta);
		_tess_edge br_bl_edge(0, 0, br_bl_delta);
		_tess_edge bl_tl_edge(0, 0, bl_tl_delta);

		tl_tr_edge.outermost_tess_level = run.outer[3];
		tr_br_edge.outermost_tess_level = run.outer[2];
		br_bl_edge.outermost_tess_level = run.outer[1];
		bl_tl_edge.outermost_tess_level = run.outer[0];

		if (n_iteration == 0)
		{
			tl_tr_edge.tess_level = run.outer[3];
			tr_br_edge.tess_level = run.outer[2];
			br_bl_edge.tess_level = run.outer[1];
			bl_tl_edge.tess_level = run.outer[0];
		}
		else
		{
			tl_tr_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			br_bl_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			tr_br_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
			bl_tl_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
		}

		/* Add corner points to edge descriptors. Do *NOT* add the same point twice, as
		 * that will confuse verifyEdges() and cause incorrect failures.
		 */
		tl_tr_edge.points.push_back(current_tl_point);

		if (!(current_tl_point == current_tr_point))
		{
			tl_tr_edge.points.push_back(current_tr_point);
		}

		tr_br_edge.points.push_back(current_tr_point);

		if (!(current_tr_point == current_br_point))
		{
			tr_br_edge.points.push_back(current_br_point);
		}

		br_bl_edge.points.push_back(current_br_point);

		if (!(current_br_point == current_bl_point))
		{
			br_bl_edge.points.push_back(current_bl_point);
		}

		bl_tl_edge.points.push_back(current_bl_point);

		if (!(current_bl_point == current_tl_point))
		{
			bl_tl_edge.points.push_back(current_tl_point);
		}

		/* Identify points that lie on any of the edges considered */
		_tess_edge*		   edge_ptrs[] = { &tl_tr_edge, &tr_br_edge, &br_bl_edge, &bl_tl_edge };
		const unsigned int n_edge_ptrs = sizeof(edge_ptrs) / sizeof(edge_ptrs[0]);

		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			/* Degenerate edges will only consist of one point, for which the following
			 * code needs not be executed */
			if (edge.points.size() > 1)
			{
				/* Retrieve edge's start & end points */
				_tess_coordinate_cartesian edge_start_point = edge.points[0];
				_tess_coordinate_cartesian edge_end_point   = edge.points[1];

				/* Iterate over the data set */
				for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = coordinates.begin();
					 iterator != coordinates.end(); iterator++)
				{
					const _tess_coordinate_cartesian& coordinate = *iterator;

					if (isPointOnLine(edge_start_point, edge_end_point, coordinate) &&
						!(edge_start_point == coordinate) && !(edge_end_point == coordinate))
					{
						/* Make sure the point has not already been added. If this happens,
						 * it is very likely there is a bug in the way the implementation's
						 * support of point mode */
						if (std::find_if(edge.points.begin(), edge.points.end(),
										 _comparator_exact_tess_coordinate_match(coordinate)) == edge.points.end())
						{
							edge.points.push_back(coordinate);
						}
						else
						{
							std::string primitive_mode_string =
								TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
							std::string vertex_spacing_string =
								TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

							m_testCtx.getLog()
								<< tcu::TestLog::Message << "A duplicate vertex"
								<< " (" << coordinate.x << ", " << coordinate.y
								<< ") was found in set of coordinates generated for the following configuration:"
								<< " inner tessellation levels:(" << run.inner[0] << ", " << run.inner[1]
								<< ") outer tessellation levels:(" << run.outer[0] << ", " << run.outer[1] << ", "
								<< run.outer[2] << ", " << run.outer[3] << ") primitive mode:" << primitive_mode_string
								<< " vertex spacing mode:" << vertex_spacing_string << " point mode:yes"
								<< tcu::TestLog::EndMessage;

							TCU_FAIL("A duplicate vertex was found in generated tessellation coordinate set "
									 "when point mode was used");
						}
					}
				} /* for (all coordinates in the data set) */

				/* Sort all points in the edge relative to the start point */
				std::sort(edge.points.begin(), edge.points.end(), _comparator_relative_to_base_point(edge_start_point));
			}
		} /* for (all edges) */

		/* Remove all coordinates associated to edges from the data set */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = edge.points.begin();
				 iterator != edge.points.end(); iterator++)
			{
				const _tess_coordinate_cartesian&				  coordinate = *iterator;
				std::vector<_tess_coordinate_cartesian>::iterator dataset_iterator =
					std::find(coordinates.begin(), coordinates.end(), coordinate);

				if (dataset_iterator != coordinates.end())
				{
					coordinates.erase(dataset_iterator);
				}
			} /* for (all edge points) */
		}	 /* for (all edges) */

		/* Store the edges */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			result.push_back(edge);
		}
	} /* for (both iterations) */

	return result;
}